

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O2

void tmvline4_addclamp(void)

{
  DWORD *pDVar1;
  DWORD *pDVar2;
  int iVar3;
  byte *pbVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  byte *pbVar9;
  long lVar10;
  
  iVar3 = tmvlinebits;
  pDVar2 = dc_destblend;
  pDVar1 = dc_srcblend;
  pbVar4 = dc_dest;
  iVar6 = dc_count;
  do {
    lVar10 = 0;
    pbVar9 = pbVar4;
    for (lVar8 = 0; lVar8 != 0x20; lVar8 = lVar8 + 8) {
      uVar5 = *(uint *)((long)vplce + lVar10);
      uVar7 = (ulong)*(byte *)(*(long *)((long)bufplce + lVar8) +
                              (ulong)(uVar5 >> ((byte)iVar3 & 0x3f)));
      if (uVar7 != 0) {
        uVar5 = pDVar2[*pbVar9] + pDVar1[*(byte *)(*(long *)((long)palookupoffse + lVar8) + uVar7)]
                & 0x40100400;
        uVar5 = uVar5 - (uVar5 >> 5) |
                pDVar2[*pbVar9] + pDVar1[*(byte *)(*(long *)((long)palookupoffse + lVar8) + uVar7)]
                & 0x3e0f83e0 | 0x1f07c1f;
        *pbVar9 = RGB32k.All[uVar5 >> 0xf & uVar5];
        uVar5 = *(uint *)((long)vplce + lVar10);
      }
      *(uint *)((long)vplce + lVar10) = uVar5 + *(int *)((long)vince + lVar10);
      lVar10 = lVar10 + 4;
      pbVar9 = pbVar9 + 1;
    }
    pbVar4 = pbVar4 + dc_pitch;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  return;
}

Assistant:

void tmvline4_addclamp ()
{
	BYTE *dest = dc_dest;
	int count = dc_count;
	int bits = tmvlinebits;

	DWORD *fg2rgb = dc_srcblend;
	DWORD *bg2rgb = dc_destblend;

	do
	{
		for (int i = 0; i < 4; ++i)
		{
			BYTE pix = bufplce[i][vplce[i] >> bits];
			if (pix != 0)
			{
				DWORD a = fg2rgb[palookupoffse[i][pix]] + bg2rgb[dest[i]];
				DWORD b = a;

				a |= 0x01f07c1f;
				b &= 0x40100400;
				a &= 0x3fffffff;
				b = b - (b >> 5);
				a |= b;
				dest[i] = RGB32k.All[a & (a>>15)];
			}
			vplce[i] += vince[i];
		}
		dest += dc_pitch;
	} while (--count);
}